

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

int __thiscall OpenMD::RNEMD::RNEMD::getBin(RNEMD *this,Vector3d *pos)

{
  double *pdVar1;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  double dVar2;
  double dVar3;
  Vector3d *in_stack_00000018;
  Snapshot *in_stack_00000020;
  Vector3d rPos;
  Vector<double,_3U> *in_stack_ffffffffffffff98;
  Vector<double,_3U> *in_stack_ffffffffffffffa0;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x289) & 1) == 0) {
    OpenMD::operator-(in_RSI,in_stack_ffffffffffffffa0);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
    ;
    dVar3 = Vector<double,_3U>::length((Vector<double,_3U> *)0x4069a6);
    local_4 = (uint)(dVar3 / *(double *)(in_RDI + 0x1c28));
  }
  else {
    Snapshot::wrapVector(in_stack_00000020,in_stack_00000018);
    dVar2 = (double)*(uint *)(in_RDI + 0x1c20);
    pdVar1 = Vector<double,_3U>::operator[](in_RSI,*(uint *)(in_RDI + 0x240));
    dVar3 = *pdVar1;
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x18),*(uint *)(in_RDI + 0x240),
                        *(uint *)(in_RDI + 0x240));
    local_4 = (uint)(int)(dVar2 * (dVar3 / *pdVar1 + 0.5)) % *(uint *)(in_RDI + 0x1c20);
  }
  return local_4;
}

Assistant:

int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }